

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

void Acb_FindReplace(sat_solver *pSat,int iFirstDiv,Vec_Int_t *vWeights,Vec_Wrd_t *vPats,int nPats,
                    Vec_Int_t *vSupp)

{
  int nWords_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  word *pwVar5;
  int *begin;
  int *end;
  int iDiv;
  word *pMask;
  word Mask [256];
  word Both [256];
  word Covered [256];
  int nWords;
  int status;
  int iLit2;
  int iLit;
  int k;
  int i;
  Vec_Int_t *vSupp_local;
  int nPats_local;
  Vec_Wrd_t *vPats_local;
  Vec_Int_t *vWeights_local;
  int iFirstDiv_local;
  sat_solver *pSat_local;
  
  nWords_00 = Abc_Bit6WordNum(nPats);
  if (0x100 < nWords_00) {
    __assert_fail("nWords <= NWORDS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                  ,0x44e,
                  "void Acb_FindReplace(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  Abc_TtConst((word *)&pMask,nWords_00,0);
  for (iLit = 0; iLit < nPats; iLit = iLit + 1) {
    Abc_TtSetBit((word *)&pMask,iLit);
  }
  iLit = 0;
  do {
    iVar1 = Vec_IntSize(vSupp);
    if (iVar1 <= iLit) {
      return;
    }
    iVar1 = Vec_IntEntry(vSupp,iLit);
    iVar2 = Abc_Lit2Var(iVar1);
    iVar2 = iVar2 - iFirstDiv;
    Abc_TtConst(Both + 0xff,nWords_00,0);
    for (iLit2 = 0; iVar3 = Vec_IntSize(vSupp), iLit2 < iVar3; iLit2 = iLit2 + 1) {
      iVar3 = Vec_IntEntry(vSupp,iLit2);
      if (iVar3 != iVar1) {
        iVar3 = Abc_Lit2Var(iVar3);
        pwVar5 = Vec_WrdEntryP(vPats,(iVar3 - iFirstDiv) * 0x100);
        Abc_TtOr(Both + 0xff,Both + 0xff,pwVar5,nWords_00);
      }
    }
    for (iLit2 = 0; iLit2 < iVar2; iLit2 = iLit2 + 1) {
      iVar3 = Vec_IntEntry(vWeights,iLit2);
      iVar4 = Vec_IntEntry(vWeights,iVar2);
      if (iVar3 != iVar4) {
        iVar3 = Vec_IntEntry(vWeights,iLit2);
        iVar4 = Vec_IntEntry(vWeights,iVar2);
        if (iVar4 <= iVar3) {
          __assert_fail("Vec_IntEntry(vWeights, k) < Vec_IntEntry(vWeights, iDiv)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                        ,0x465,
                        "void Acb_FindReplace(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int, Vec_Int_t *)"
                       );
        }
        pwVar5 = Vec_WrdEntryP(vPats,iLit2 << 8);
        Abc_TtOr(Mask + 0xff,Both + 0xff,pwVar5,nWords_00);
        iVar3 = Abc_TtEqual(Mask + 0xff,(word *)&pMask,nWords_00);
        if (iVar3 != 0) {
          iVar3 = Abc_Var2Lit(iFirstDiv + iLit2,1);
          Vec_IntWriteEntry(vSupp,iLit,iVar3);
          begin = Vec_IntArray(vSupp);
          end = Vec_IntLimit(vSupp);
          iVar3 = sat_solver_solve(pSat,begin,end,0,0,0,0);
          if (iVar3 == -1) break;
          Vec_IntWriteEntry(vSupp,iLit,iVar1);
        }
      }
    }
    iLit = iLit + 1;
  } while( true );
}

Assistant:

void Acb_FindReplace( sat_solver * pSat, int iFirstDiv, Vec_Int_t * vWeights, Vec_Wrd_t * vPats, int nPats, Vec_Int_t * vSupp )
{
    int i, k, iLit, iLit2, status, nWords = Abc_Bit6WordNum(nPats);
    word Covered[NWORDS], Both[NWORDS], Mask[NWORDS], * pMask; 
    assert( nWords <= NWORDS );
    // prepare constant pattern
    Abc_TtConst( Mask, nWords, 0 );
    for ( i = 0; i < nPats; i++ )
        Abc_TtSetBit( Mask, i );
    // try to replace each by a cheaper one
    Vec_IntForEachEntry( vSupp, iLit, i )
    {
        int iDiv = Abc_Lit2Var(iLit) - iFirstDiv;
        // collect covered except by this one
        Abc_TtConst( Covered, nWords, 0 );
        Vec_IntForEachEntry( vSupp, iLit2, k )
        {
            if ( iLit2 == iLit )
                continue;
            pMask = Vec_WrdEntryP( vPats, NWORDS*(Abc_Lit2Var(iLit2) - iFirstDiv) );
            Abc_TtOr( Covered, Covered, pMask, nWords );
        }
        // consider any cheaper ones that this one
        for ( k = 0; k < iDiv; k++ )
        {
            if ( Vec_IntEntry(vWeights, k) == Vec_IntEntry(vWeights, iDiv) )
                continue;
            assert( Vec_IntEntry(vWeights, k) < Vec_IntEntry(vWeights, iDiv) );
            pMask = Vec_WrdEntryP( vPats, NWORDS*k );
            // check if it covers the remaining ones
            Abc_TtOr( Both, Covered, pMask, nWords );
            if ( !Abc_TtEqual(Both, Mask, nWords) )
                continue;
            // try this one
            Vec_IntWriteEntry( vSupp, i, Abc_Var2Lit(iFirstDiv+k, 1) );
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( status == l_False ) // success
            {
                //printf( "Replacing %d(%d) by %d(%d) with const difference %d.\n",
                //    iDiv, Vec_IntEntry(vWeights, iDiv), k, Vec_IntEntry(vWeights, k), 
                //    Vec_IntEntry(vWeights, iDiv) - Vec_IntEntry(vWeights, k) );
                break;
            }
            Vec_IntWriteEntry( vSupp, i, iLit );
        }
    }
}